

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

int32_t __thiscall fasttext::Dictionary::find(Dictionary *this,string *w)

{
  uint32_t h;
  int32_t iVar1;
  
  h = hash(this,w);
  iVar1 = find(this,w,h);
  return iVar1;
}

Assistant:

int32_t Dictionary::find(const std::string& w) const {
	return find(w, hash(w));
}